

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O1

Reals __thiscall Omega_h::symms_inria2osh(Omega_h *this,Int dim,Reals *symms)

{
  int *piVar1;
  void *pvVar2;
  void *extraout_RDX;
  Alloc *this_00;
  Reals RVar3;
  Reals local_40;
  Reals local_30;
  Reals local_20;
  
  if (dim == 1) {
    local_40.write_.shared_alloc_.alloc = (symms->write_).shared_alloc_.alloc;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40.write_.shared_alloc_.alloc =
             (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.write_.shared_alloc_.alloc)->use_count =
             (local_40.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_40.write_.shared_alloc_.direct_ptr = (symms->write_).shared_alloc_.direct_ptr;
    RVar3 = symms_inria2osh_dim<1>(this,&local_40);
    pvVar2 = RVar3.write_.shared_alloc_.direct_ptr;
    this_00 = local_40.write_.shared_alloc_.alloc;
  }
  else if (dim == 2) {
    local_30.write_.shared_alloc_.alloc = (symms->write_).shared_alloc_.alloc;
    if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
        local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_30.write_.shared_alloc_.alloc =
             (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_30.write_.shared_alloc_.alloc)->use_count =
             (local_30.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_30.write_.shared_alloc_.direct_ptr = (symms->write_).shared_alloc_.direct_ptr;
    RVar3 = symms_inria2osh_dim<2>(this,&local_30);
    pvVar2 = RVar3.write_.shared_alloc_.direct_ptr;
    this_00 = local_30.write_.shared_alloc_.alloc;
  }
  else {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x6a);
    }
    local_20.write_.shared_alloc_.alloc = (symms->write_).shared_alloc_.alloc;
    if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
        local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_20.write_.shared_alloc_.alloc =
             (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_20.write_.shared_alloc_.alloc)->use_count =
             (local_20.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_20.write_.shared_alloc_.direct_ptr = (symms->write_).shared_alloc_.direct_ptr;
    RVar3 = symms_inria2osh_dim<3>(this,&local_20);
    pvVar2 = RVar3.write_.shared_alloc_.direct_ptr;
    this_00 = local_20.write_.shared_alloc_.alloc;
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar2 = extraout_RDX;
    }
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals symms_inria2osh(Int dim, Reals symms) {
  if (dim == 3) return symms_inria2osh_dim<3>(symms);
  if (dim == 2) return symms_inria2osh_dim<2>(symms);
  if (dim == 1) return symms_inria2osh_dim<1>(symms);
  OMEGA_H_NORETURN(Reals());
}